

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderExtensionTestCase::ShaderExtensionTestCase
          (ShaderExtensionTestCase *this,Context *context,string *extension)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"ShaderExtension",
             "Verifies if extension is available for GLSL");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderExtensionTestCase_01ddc118;
  std::__cxx11::string::string((string *)&this->mExtension,(string *)extension);
  return;
}

Assistant:

ShaderExtensionTestCase::ShaderExtensionTestCase(deqp::Context& context, const std::string extension)
	: TestCase(context, "ShaderExtension", "Verifies if extension is available for GLSL"), mExtension(extension)
{
	/* Left blank intentionally */
}